

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O0

void Gia_IsoAssignUnique(Gia_IsoMan_t *p)

{
  int *piVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *t;
  int nSize;
  int iBegin;
  int i;
  Gia_IsoMan_t *p_local;
  
  p->nSingles = 0;
  Vec_IntClear(p->vClasses2);
  nSize = 0;
  do {
    iVar3 = Vec_IntSize(p->vClasses);
    if (iVar3 <= nSize + 1) {
      pVVar2 = p->vClasses;
      p->vClasses = p->vClasses2;
      p->vClasses2 = pVVar2;
      p->nEntries = p->nEntries - p->nSingles;
      return;
    }
    iVar3 = Vec_IntEntry(p->vClasses,nSize);
    iVar4 = Vec_IntEntry(p->vClasses,nSize + 1);
    if (iVar4 == 1) {
      piVar1 = p->pUniques;
      uVar5 = Gia_IsoGetItem(p,iVar3);
      if (piVar1[uVar5] != 0) {
        __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                      ,0x112,"void Gia_IsoAssignUnique(Gia_IsoMan_t *)");
      }
      iVar4 = p->nUniques;
      p->nUniques = iVar4 + 1;
      piVar1 = p->pUniques;
      uVar5 = Gia_IsoGetItem(p,iVar3);
      piVar1[uVar5] = iVar4;
      p->nSingles = p->nSingles + 1;
    }
    else {
      Vec_IntPush(p->vClasses2,iVar3);
      Vec_IntPush(p->vClasses2,iVar4);
    }
    nSize = nSize + 2;
  } while( true );
}

Assistant:

void Gia_IsoAssignUnique( Gia_IsoMan_t * p )
{
    int i, iBegin, nSize;
    p->nSingles = 0;
    Vec_IntClear( p->vClasses2 );
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        if ( nSize == 1 )
        {
            assert( p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0 );
            p->pUniques[Gia_IsoGetItem(p, iBegin)] = p->nUniques++;
            p->nSingles++;
        }
        else
        {
            Vec_IntPush( p->vClasses2, iBegin );
            Vec_IntPush( p->vClasses2, nSize );
        }
    }
    ABC_SWAP( Vec_Int_t *, p->vClasses, p->vClasses2 );
    p->nEntries -= p->nSingles;
}